

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O1

MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *
wasm::WATParser::anon_unknown_21::maybeAction
          (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
           *__return_storage_ptr__,Lexer *in)

{
  int64_t *piVar1;
  undefined8 *puVar2;
  Literal *other;
  array<wasm::Literal,_1UL> *paVar3;
  bool *this;
  undefined1 *puVar4;
  bool bVar5;
  bool bVar6;
  _Variant_storage<false,_wasm::Literal,_wasm::Err> *x;
  SmallVector<wasm::Literal,_1UL> *other_00;
  _Alloc_hider _Var7;
  string_view expected;
  string_view expected_00;
  undefined1 auStack_1f8 [8];
  optional<wasm::Name> name;
  optional<wasm::Name> id;
  Result<wasm::Literal> _val;
  undefined1 local_190 [16];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  undefined1 auStack_100 [8];
  optional<wasm::Name> id_1;
  undefined1 auStack_c0 [8];
  Result<wasm::Literal> l;
  Literals lits;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_50;
  
  expected._M_str = "invoke";
  expected._M_len = 6;
  bVar5 = Lexer::takeSExprStart(in,expected);
  if (bVar5) {
    Lexer::takeID((optional<wasm::Name> *)
                  &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_engaged,in);
    Lexer::takeName((optional<wasm::Name> *)auStack_1f8,in);
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_index = '\0';
      l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._33_7_ = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged;
      do {
        bVar5 = Lexer::peekRParen(in);
        if (bVar5) {
          auStack_100 = (undefined1  [8])
                        l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
          Literal::Literal((Literal *)&id_1,(Literal *)&lits);
          lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          bVar5 = false;
LAB_00c2e17e:
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
          Literal::~Literal((Literal *)&lits);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Literals,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literals,_wasm::Err> *)
                          ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),
                          (_Copy_ctor_base<false,_wasm::Literals,_wasm::Err> *)auStack_100);
          if ((char)lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == '\x01') {
            puVar4 = (undefined1 *)
                     ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
            auStack_c0 = (undefined1  [8])puVar4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)auStack_c0,
                       l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_,
                       lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed +
                       l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_);
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 = puVar2;
            if (auStack_c0 == (undefined1  [8])puVar4) {
              *puVar2 = CONCAT71(l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._9_7_,
                                 l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u.
                                 _M_first._M_storage._M_storage[8]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x18) = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined1 (*) [8])
               &(__return_storage_ptr__->val).
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                   = auStack_c0;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        + 0x10) =
                   CONCAT71(l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._9_7_,
                            l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._M_first.
                            _M_storage._M_storage[8]);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             + 8) = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
            l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_ = 0;
            l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._M_first._M_storage.
            _M_storage[8] = '\0';
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             + 0x68) = '\x02';
            auStack_c0 = (undefined1  [8])puVar4;
            std::__detail::__variant::_Variant_storage<false,_wasm::Literals,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::Err> *)
                              ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Literals,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::Err> *)
                              ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
            bVar6 = Lexer::takeRParen(in);
            if (bVar6) {
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
                   (int64_t)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_payload._M_value.
                            super_IString.str._M_str;
              l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_index =
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_engaged;
              l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._33_7_ =
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._17_7_;
              lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
                   id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
              super_IString.str._M_str = (char *)auStack_1f8;
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
              other_00 = (SmallVector<wasm::Literal,_1UL> *)0x0;
              if (!bVar5) {
                other_00 = (SmallVector<wasm::Literal,_1UL> *)auStack_100;
              }
              SmallVector<wasm::Literal,_1UL>::SmallVector
                        ((SmallVector<wasm::Literal,_1UL> *)
                         &lits.super_SmallVector<wasm::Literal,_1UL>.flexible,other_00);
              other = (Literal *)
                      &lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              *(uintptr_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x20) = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
              *(int64_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x10) = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
              *(char **)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                .
                                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        + 0x18) =
                   lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
                   super_IString.str._M_str;
              *(undefined8 *)
               &(__return_storage_ptr__->val).
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                   = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                     super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
              *(size_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 8) = lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
              *(pointer *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x28) = lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start;
              Literal::Literal((Literal *)
                               ((long)&(__return_storage_ptr__->val).
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                       .
                                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               + 0x30),other);
              *(pointer *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x48) = local_50.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              *(pointer *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x50) = local_50.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x58) = local_50.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_50.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_50.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_50.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x60) = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x68) = '\0';
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_50);
              Literal::~Literal(other);
            }
            else {
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_160,"expected end of invoke action","");
              Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
                         &local_160);
              piVar1 = (int64_t *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       + 0x10);
              *(int64_t **)
               &(__return_storage_ptr__->val).
                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                   = piVar1;
              paVar3 = &lits.super_SmallVector<wasm::Literal,_1UL>.fixed;
              if ((array<wasm::Literal,_1UL> *)
                  l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                  super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ == paVar3) {
                *piVar1 = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
                *(char **)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          + 0x18) =
                     lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
                     super_IString.str._M_str;
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->val).
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
                *(int64_t *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 + 0x10) = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
              }
              *(size_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 8) = lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
              lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
              super_IString.str._M_len =
                   lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
                   super_IString.str._M_len & 0xffffffffffffff00;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x68) = '\x02';
              l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ = paVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
            }
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Literals,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::Err> *)auStack_100);
          return __return_storage_ptr__;
        }
        const_((Result<wasm::Literal> *)auStack_c0,in);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Literal,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Literal,_wasm::Err> *)this,
                   (_Copy_ctor_base<false,_wasm::Literal,_wasm::Err> *)auStack_c0);
        if (_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') {
          _val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ = local_190;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),
                     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_,
                     _val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                     super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_ +
                     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_);
          auStack_100 = (undefined1  [8])
                        ((long)&id_1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                super__Optional_payload_base<wasm::Name>._M_payload + 8);
          if ((undefined1 *)
              _val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ == local_190) {
            id_1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._16_8_ = local_190._8_8_;
          }
          else {
            auStack_100 = (undefined1  [8])
                          _val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
          }
          bVar5 = true;
          std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)
                            &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._M_engaged);
          std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)auStack_c0);
          goto LAB_00c2e17e;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)this);
        x = (_Variant_storage<false,_wasm::Literal,_wasm::Err> *)0x0;
        if (l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
          x = (_Variant_storage<false,_wasm::Literal,_wasm::Err> *)auStack_c0;
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)
                   ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),(Literal *)x);
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)auStack_c0);
      } while( true );
    }
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"expected export name","");
    Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,&local_180
              );
    piVar1 = (int64_t *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             + 0x10);
    *(int64_t **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         = piVar1;
    if ((array<wasm::Literal,_1UL> *)
        l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ ==
        &lits.super_SmallVector<wasm::Literal,_1UL>.fixed) {
      *piVar1 = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      *(char **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                + 0x18) =
           lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
           str._M_str;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
           = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
      *(int64_t *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 0x10) = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
     + 8) = lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
    _M_len = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString
             .str._M_len & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
     + 0x68) = '\x02';
    local_140.field_2._M_allocated_capacity = local_180.field_2._M_allocated_capacity;
    _Var7._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == &local_180.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    expected_00._M_str = "get";
    expected_00._M_len = 3;
    bVar5 = Lexer::takeSExprStart(in,expected_00);
    if (!bVar5) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 0x68) = '\x01';
      return __return_storage_ptr__;
    }
    Lexer::takeID((optional<wasm::Name> *)auStack_100,in);
    Lexer::takeName((optional<wasm::Name> *)auStack_c0,in);
    if (l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._M_first._M_storage._M_storage
        [8] == '\0') {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"expected export name","");
      Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
                 &local_140);
      piVar1 = (int64_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x10);
      *(int64_t **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
           = piVar1;
      if ((array<wasm::Literal,_1UL> *)
          l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ ==
          &lits.super_SmallVector<wasm::Literal,_1UL>.fixed) {
        *piVar1 = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
        *(char **)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  + 0x18) =
             lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString
             .str._M_str;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
        *(int64_t *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x10) = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      }
      *(size_t *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 8) = lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_len = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
               super_IString.str._M_len & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 0x68) = '\x02';
      _Var7._M_p = local_140._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p == &local_140.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      bVar5 = Lexer::takeRParen(in);
      if (bVar5) {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             = auStack_100;
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 8) = id_1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x20) = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                   super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
        *(char **)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  + 0x10) =
             id_1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str;
        *(undefined1 (*) [8])
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x18) = auStack_c0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x60) = 1;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x68) = '\0';
        return __return_storage_ptr__;
      }
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"expected end of get action","");
      Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
                 &local_120);
      piVar1 = (int64_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               + 0x10);
      *(int64_t **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
           = piVar1;
      if ((array<wasm::Literal,_1UL> *)
          l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ ==
          &lits.super_SmallVector<wasm::Literal,_1UL>.fixed) {
        *piVar1 = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
        *(char **)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  + 0x18) =
             lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString
             .str._M_str;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
        *(int64_t *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x10) = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      }
      *(size_t *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 8) = lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_len = lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
               super_IString.str._M_len & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 0x68) = '\x02';
      local_140.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
      _Var7._M_p = local_120._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p == &local_120.field_2) {
        return __return_storage_ptr__;
      }
    }
  }
  l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
  super__Move_assign_alias<wasm::Literal,_wasm::Err>.
  super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
  super__Move_ctor_alias<wasm::Literal,_wasm::Err>.super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
  super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ =
       &lits.super_SmallVector<wasm::Literal,_1UL>.fixed;
  lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  operator_delete(_Var7._M_p,local_140.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<Action> maybeAction(Lexer& in) {
  if (in.takeSExprStart("invoke"sv)) {
    auto id = in.takeID();
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    auto args = consts(in);
    CHECK_ERR(args);
    if (!in.takeRParen()) {
      return in.err("expected end of invoke action");
    }
    return InvokeAction{id, *name, *args};
  }

  if (in.takeSExprStart("get"sv)) {
    auto id = in.takeID();
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of get action");
    }
    return GetAction{id, *name};
  }

  return {};
}